

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Equalizer.cpp
# Opt level: O0

int Equalizer::GetFloatBufferCallback
              (UnityAudioEffectState *state,char *name,float *buffer,int numsamples)

{
  int iVar1;
  Data *data_00;
  Data *data;
  float *pfStack_20;
  int numsamples_local;
  float *buffer_local;
  char *name_local;
  UnityAudioEffectState *state_local;
  
  pfStack_20 = buffer;
  buffer_local = (float *)name;
  name_local = (char *)state;
  data_00 = (Data *)UnityAudioEffectState::GetEffectData<Equalizer::EffectData>(state);
  iVar1 = strcmp((char *)buffer_local,"InputSpec");
  if (iVar1 == 0) {
    FFTAnalyzer::ReadBuffer(&data_00->analyzer,pfStack_20,numsamples,true);
  }
  else {
    iVar1 = strcmp((char *)buffer_local,"OutputSpec");
    if (iVar1 == 0) {
      FFTAnalyzer::ReadBuffer(&data_00->analyzer,pfStack_20,numsamples,false);
    }
    else {
      iVar1 = strcmp((char *)buffer_local,"Coeffs");
      if (iVar1 == 0) {
        SetupFilterCoeffs(data_00,data_00->DisplayFilterCoeffs,data_00->DisplayFilterCoeffs + 1,
                          data_00->DisplayFilterCoeffs + 2,(float)*(uint *)(name_local + 4));
        BiquadFilter::StoreCoeffs(data_00->DisplayFilterCoeffs + 2,&stack0xffffffffffffffe0);
        BiquadFilter::StoreCoeffs(data_00->DisplayFilterCoeffs + 1,&stack0xffffffffffffffe0);
        BiquadFilter::StoreCoeffs(data_00->DisplayFilterCoeffs,&stack0xffffffffffffffe0);
      }
      else {
        memset(pfStack_20,0,(long)numsamples << 2);
      }
    }
  }
  return 0;
}

Assistant:

int UNITY_AUDIODSP_CALLBACK GetFloatBufferCallback(UnityAudioEffectState* state, const char* name, float* buffer, int numsamples)
    {
        EffectData::Data* data = &state->GetEffectData<EffectData>()->data;
        if (strcmp(name, "InputSpec") == 0)
            data->analyzer.ReadBuffer(buffer, numsamples, true);
        else if (strcmp(name, "OutputSpec") == 0)
            data->analyzer.ReadBuffer(buffer, numsamples, false);
        else if (strcmp(name, "Coeffs") == 0)
        {
            SetupFilterCoeffs(data, &data->DisplayFilterCoeffs[0], &data->DisplayFilterCoeffs[1], &data->DisplayFilterCoeffs[2], (float)state->samplerate);
            data->DisplayFilterCoeffs[2].StoreCoeffs(buffer);
            data->DisplayFilterCoeffs[1].StoreCoeffs(buffer);
            data->DisplayFilterCoeffs[0].StoreCoeffs(buffer);
        }
        else
            memset(buffer, 0, sizeof(float) * numsamples);

        return UNITY_AUDIODSP_OK;
    }